

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

wchar_t assertion_make_hardlink(char *file,wchar_t line,char *newpath,char *linkto)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  wchar_t in_ESI;
  char *in_RDI;
  wchar_t succeeded;
  wchar_t local_4;
  
  assertion_count(in_RDI,in_ESI);
  iVar1 = link(in_RCX,in_RDX);
  if (iVar1 != 0) {
    failure_start(in_RDI,(wchar_t)(ulong)(uint)in_ESI,"Could not create hardlink");
    logprintf("   New link: %s\n",in_RDX);
    logprintf("   Old name: %s\n",in_RCX);
    failure_finish((void *)0x11e35c);
  }
  local_4 = (wchar_t)(iVar1 == 0);
  return local_4;
}

Assistant:

int
assertion_make_hardlink(const char *file, int line,
    const char *newpath, const char *linkto)
{
	int succeeded;

	assertion_count(file, line);
#if defined(_WIN32) && !defined(__CYGWIN__)
	succeeded = my_CreateHardLinkA(newpath, linkto);
#elif HAVE_LINK
	succeeded = !link(linkto, newpath);
#else
	succeeded = 0;
#endif
	if (succeeded)
		return (1);
	failure_start(file, line, "Could not create hardlink");
	logprintf("   New link: %s\n", newpath);
	logprintf("   Old name: %s\n", linkto);
	failure_finish(NULL);
	return(0);
}